

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t uprv_strCompare_63(UChar *s1,int32_t length1,UChar *s2,int32_t length2,UBool strncmpStyle,
                          UBool codePointOrder)

{
  int iVar1;
  long lVar2;
  uint local_58;
  UChar local_54;
  UChar local_52;
  int32_t lengthResult;
  UChar c2;
  UChar c1;
  UChar *limit2;
  UChar *limit1;
  UChar *start2;
  UChar *start1;
  UBool codePointOrder_local;
  UBool strncmpStyle_local;
  UChar *pUStack_28;
  int32_t length2_local;
  UChar *s2_local;
  UChar *pUStack_18;
  int32_t length1_local;
  UChar *s1_local;
  
  pUStack_28 = s2;
  pUStack_18 = s1;
  if ((length1 < 0) && (length2 < 0)) {
    if (s1 == s2) {
      return 0;
    }
    while( true ) {
      local_52 = *pUStack_18;
      local_54 = *pUStack_28;
      if (local_52 != local_54) break;
      if (local_52 == L'\0') {
        return 0;
      }
      pUStack_18 = pUStack_18 + 1;
      pUStack_28 = pUStack_28 + 1;
    }
    _lengthResult = (UChar *)0x0;
    limit2 = (UChar *)0x0;
  }
  else {
    if (strncmpStyle == '\0') {
      s2_local._4_4_ = length1;
      if (length1 < 0) {
        s2_local._4_4_ = u_strlen_63(s1);
      }
      start1._4_4_ = length2;
      if (length2 < 0) {
        start1._4_4_ = u_strlen_63(s2);
      }
      if (s2_local._4_4_ < start1._4_4_) {
        local_58 = 0xffffffff;
        iVar1 = s2_local._4_4_;
      }
      else {
        iVar1 = start1._4_4_;
        if (s2_local._4_4_ == start1._4_4_) {
          iVar1 = s2_local._4_4_;
        }
        local_58 = (uint)(s2_local._4_4_ != start1._4_4_);
      }
      limit2 = s1 + iVar1;
      if (s1 == s2) {
        return local_58;
      }
      while( true ) {
        if (pUStack_18 == limit2) {
          return local_58;
        }
        local_52 = *pUStack_18;
        local_54 = *pUStack_28;
        if (local_52 != local_54) break;
        pUStack_18 = pUStack_18 + 1;
        pUStack_28 = pUStack_28 + 1;
      }
      limit2 = s1 + s2_local._4_4_;
      lVar2 = (long)start1._4_4_;
    }
    else {
      if (s1 == s2) {
        return 0;
      }
      limit2 = s1 + length1;
      while( true ) {
        if (pUStack_18 == limit2) {
          return 0;
        }
        local_52 = *pUStack_18;
        local_54 = *pUStack_28;
        if (local_52 != local_54) break;
        if (local_52 == L'\0') {
          return 0;
        }
        pUStack_18 = pUStack_18 + 1;
        pUStack_28 = pUStack_28 + 1;
      }
      lVar2 = (long)length1;
    }
    _lengthResult = s2 + lVar2;
  }
  if (((0xd7ff < (ushort)local_52) && (0xd7ff < (ushort)local_54)) && (codePointOrder != '\0')) {
    if ((((0xdbff < (ushort)local_52) || (pUStack_18 + 1 == limit2)) ||
        ((pUStack_18[1] & 0xfc00U) != 0xdc00)) &&
       ((((local_52 & 0xfc00U) != 0xdc00 || (s1 == pUStack_18)) ||
        ((pUStack_18[-1] & 0xfc00U) != 0xd800)))) {
      local_52 = local_52 + L'\xd800';
    }
    if ((((0xdbff < (ushort)local_54) || (pUStack_28 + 1 == _lengthResult)) ||
        ((pUStack_28[1] & 0xfc00U) != 0xdc00)) &&
       ((((local_54 & 0xfc00U) != 0xdc00 || (s2 == pUStack_28)) ||
        ((pUStack_28[-1] & 0xfc00U) != 0xd800)))) {
      local_54 = local_54 + L'\xd800';
    }
  }
  return (uint)(ushort)local_52 - (uint)(ushort)local_54;
}

Assistant:

U_CFUNC int32_t U_EXPORT2
uprv_strCompare(const UChar *s1, int32_t length1,
                const UChar *s2, int32_t length2,
                UBool strncmpStyle, UBool codePointOrder) {
    const UChar *start1, *start2, *limit1, *limit2;
    UChar c1, c2;

    /* setup for fix-up */
    start1=s1;
    start2=s2;

    /* compare identical prefixes - they do not need to be fixed up */
    if(length1<0 && length2<0) {
        /* strcmp style, both NUL-terminated */
        if(s1==s2) {
            return 0;
        }

        for(;;) {
            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=limit2=NULL;
    } else if(strncmpStyle) {
        /* special handling for strncmp, assume length1==length2>=0 but also check for NUL */
        if(s1==s2) {
            return 0;
        }

        limit1=start1+length1;

        for(;;) {
            /* both lengths are same, check only one limit */
            if(s1==limit1) {
                return 0;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            if(c1==0) {
                return 0;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit2=start2+length1; /* use length1 here, too, to enforce assumption */
    } else {
        /* memcmp/UnicodeString style, both length-specified */
        int32_t lengthResult;

        if(length1<0) {
            length1=u_strlen(s1);
        }
        if(length2<0) {
            length2=u_strlen(s2);
        }

        /* limit1=start1+min(lenght1, length2) */
        if(length1<length2) {
            lengthResult=-1;
            limit1=start1+length1;
        } else if(length1==length2) {
            lengthResult=0;
            limit1=start1+length1;
        } else /* length1>length2 */ {
            lengthResult=1;
            limit1=start1+length2;
        }

        if(s1==s2) {
            return lengthResult;
        }

        for(;;) {
            /* check pseudo-limit */
            if(s1==limit1) {
                return lengthResult;
            }

            c1=*s1;
            c2=*s2;
            if(c1!=c2) {
                break;
            }
            ++s1;
            ++s2;
        }

        /* setup for fix-up */
        limit1=start1+length1;
        limit2=start2+length2;
    }

    /* if both values are in or above the surrogate range, fix them up */
    if(c1>=0xd800 && c2>=0xd800 && codePointOrder) {
        /* subtract 0x2800 from BMP code points to make them smaller than supplementary ones */
        if(
            (c1<=0xdbff && (s1+1)!=limit1 && U16_IS_TRAIL(*(s1+1))) ||
            (U16_IS_TRAIL(c1) && start1!=s1 && U16_IS_LEAD(*(s1-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c1-=0x2800;
        }

        if(
            (c2<=0xdbff && (s2+1)!=limit2 && U16_IS_TRAIL(*(s2+1))) ||
            (U16_IS_TRAIL(c2) && start2!=s2 && U16_IS_LEAD(*(s2-1)))
        ) {
            /* part of a surrogate pair, leave >=d800 */
        } else {
            /* BMP code point - may be surrogate code point - make <d800 */
            c2-=0x2800;
        }
    }

    /* now c1 and c2 are in the requested (code unit or code point) order */
    return (int32_t)c1-(int32_t)c2;
}